

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp::forward
          (BinaryOp *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Mat *pMVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  Mat *pMVar16;
  int iVar17;
  long lVar19;
  Mat *pMVar20;
  Mat *pMVar21;
  long lVar22;
  float *pfVar23;
  ulong uVar24;
  long lVar25;
  float *pfVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  void *pvVar31;
  bool bVar32;
  float *outptr;
  undefined1 local_198 [56];
  int local_160;
  size_t local_158;
  int local_14c;
  Mat *local_148;
  Mat local_140;
  undefined1 local_f8 [44];
  int iStack_cc;
  undefined8 uStack_c8;
  int local_c0;
  size_t local_b8;
  long local_b0;
  size_t local_a8;
  long local_a0;
  float *local_98;
  float *local_90;
  size_t local_88;
  void *local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  size_t local_48;
  float *local_40;
  ulong local_38;
  int iVar18;
  
  pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_f8._40_4_ = pMVar11->dims;
  local_140.dims = pMVar11[1].dims;
  iVar17 = local_140.dims;
  if (local_140.dims < (int)local_f8._40_4_) {
    iVar17 = local_f8._40_4_;
  }
  local_f8._0_8_ = pMVar11->data;
  local_f8._8_8_ = pMVar11->refcount;
  local_f8._16_8_ = pMVar11->elemsize;
  local_f8._24_4_ = pMVar11->elempack;
  local_f8._32_8_ = pMVar11->allocator;
  uVar2 = pMVar11->h;
  uVar3 = pMVar11->d;
  uStack_c8._4_4_ = uVar3;
  uStack_c8._0_4_ = uVar2;
  iStack_cc = pMVar11->w;
  local_c0 = pMVar11->c;
  local_b8 = pMVar11->cstep;
  if ((int *)local_f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + 1;
    UNLOCK();
    local_140.dims = pMVar11[1].dims;
  }
  local_140.data = pMVar11[1].data;
  local_140.refcount = pMVar11[1].refcount;
  local_140.elemsize = pMVar11[1].elemsize;
  local_140.elempack = pMVar11[1].elempack;
  local_140.allocator = pMVar11[1].allocator;
  uVar4 = pMVar11[1].w;
  uVar5 = pMVar11[1].h;
  uVar6 = pMVar11[1].d;
  uVar7 = pMVar11[1].c;
  local_140.cstep = pMVar11[1].cstep;
  if (local_140.refcount != (int *)0x0) {
    LOCK();
    *local_140.refcount = *local_140.refcount + 1;
    UNLOCK();
  }
  pMVar21 = pMVar11 + 1;
  local_140.w = uVar4;
  local_140.h = uVar5;
  local_140.d = uVar6;
  local_140.c = uVar7;
  if (pMVar11->dims < iVar17) {
    local_148 = pMVar21;
    if (iVar17 == 2) {
      iVar13 = pMVar11->w;
      if (iVar13 == pMVar11[1].h) {
        Mat::reshape((Mat *)local_198,pMVar11,1,iVar13,(Allocator *)0x0);
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_f8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_f8._8_8_ == 0) {
            if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
              if ((float *)local_f8._0_8_ != (float *)0x0) {
                free((void *)local_f8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_f8._32_8_)[3])();
            }
          }
        }
        local_f8._0_8_ = local_198._0_8_;
        local_f8._8_8_ = local_198._8_8_;
        local_f8._16_8_ = local_198._16_8_;
        local_f8._24_4_ = local_198._24_4_;
        local_f8._32_8_ = local_198._32_8_;
        stack0xffffffffffffff30 = local_198._40_16_;
        local_c0 = local_160;
        local_b8 = local_158;
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._8_8_ == 0) {
            if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_00390990:
              local_f8._0_8_ = local_198._0_8_;
              local_f8._8_8_ = local_198._8_8_;
              local_f8._16_8_ = local_198._16_8_;
              local_f8._24_4_ = local_198._24_4_;
              local_f8._32_8_ = local_198._32_8_;
              unique0x10002127 = local_198._40_16_;
              local_c0 = local_160;
              local_b8 = local_158;
              if ((float *)local_198._0_8_ != (float *)0x0) {
                free((void *)local_198._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
      }
      else {
        Mat::reshape((Mat *)local_198,pMVar11,iVar13,1,(Allocator *)0x0);
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_f8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_f8._8_8_ == 0) {
            if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
              if ((float *)local_f8._0_8_ != (float *)0x0) {
                free((void *)local_f8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_f8._32_8_)[3])();
            }
          }
        }
        local_f8._0_8_ = local_198._0_8_;
        local_f8._8_8_ = local_198._8_8_;
        local_f8._16_8_ = local_198._16_8_;
        local_f8._24_4_ = local_198._24_4_;
        local_f8._32_8_ = local_198._32_8_;
        stack0xffffffffffffff30 = local_198._40_16_;
        local_c0 = local_160;
        local_b8 = local_158;
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._8_8_ == 0) {
            if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_00390990;
            (*(*(_func_int ***)local_198._32_8_)[3])();
          }
        }
      }
      bVar32 = false;
    }
    else {
      bVar32 = iVar17 == 3;
      if (pMVar11->dims == 1 && iVar17 == 3) {
        iVar13 = pMVar11->w;
        if (iVar13 == pMVar11[1].c) {
          Mat::reshape((Mat *)local_198,pMVar11,1,1,iVar13,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_f8._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_f8._8_8_ == 0) {
              if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
                if ((float *)local_f8._0_8_ != (float *)0x0) {
                  free((void *)local_f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_f8._32_8_)[3])();
              }
            }
          }
          local_f8._0_8_ = local_198._0_8_;
          local_f8._8_8_ = local_198._8_8_;
          local_f8._16_8_ = local_198._16_8_;
          local_f8._24_4_ = local_198._24_4_;
          local_f8._32_8_ = local_198._32_8_;
          stack0xffffffffffffff30 = local_198._40_16_;
          local_c0 = local_160;
          local_b8 = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_00391023:
                local_f8._0_8_ = local_198._0_8_;
                local_f8._8_8_ = local_198._8_8_;
                local_f8._16_8_ = local_198._16_8_;
                local_f8._24_4_ = local_198._24_4_;
                local_f8._32_8_ = local_198._32_8_;
                unique0x10002117 = local_198._40_16_;
                local_c0 = local_160;
                local_b8 = local_158;
                if ((float *)local_198._0_8_ != (float *)0x0) {
                  free((void *)local_198._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_198._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_198,pMVar11,iVar13,1,1,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_f8._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_f8._8_8_ == 0) {
              if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
                if ((float *)local_f8._0_8_ != (float *)0x0) {
                  free((void *)local_f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_f8._32_8_)[3])();
              }
            }
          }
          local_f8._0_8_ = local_198._0_8_;
          local_f8._8_8_ = local_198._8_8_;
          local_f8._16_8_ = local_198._16_8_;
          local_f8._24_4_ = local_198._24_4_;
          local_f8._32_8_ = local_198._32_8_;
          stack0xffffffffffffff30 = local_198._40_16_;
          local_c0 = local_160;
          local_b8 = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_00391023;
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
        bVar32 = true;
      }
      iVar13 = pMVar11->dims;
      if ((bool)(iVar13 == 2 & bVar32)) {
        Mat::reshape((Mat *)local_198,pMVar11,1,pMVar11->w,pMVar11->h,(Allocator *)0x0);
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
          UNLOCK();
        }
        if ((int *)local_f8._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_f8._8_8_ == 0) {
            if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
              if ((float *)local_f8._0_8_ != (float *)0x0) {
                free((void *)local_f8._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_f8._32_8_)[3])();
            }
          }
        }
        local_f8._0_8_ = local_198._0_8_;
        local_f8._8_8_ = local_198._8_8_;
        local_f8._16_8_ = local_198._16_8_;
        local_f8._24_4_ = local_198._24_4_;
        local_f8._32_8_ = local_198._32_8_;
        stack0xffffffffffffff30 = local_198._40_16_;
        local_c0 = local_160;
        local_b8 = local_158;
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._8_8_ == 0) {
            if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
              if ((float *)local_198._0_8_ != (float *)0x0) {
                free((void *)local_198._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
        iVar13 = pMVar11->dims;
      }
      bVar32 = iVar17 == 4;
      if ((bVar32) && (iVar13 == 1)) {
        iVar13 = pMVar11->w;
        if (iVar13 == pMVar11[1].c) {
          Mat::reshape((Mat *)local_198,pMVar11,1,1,1,iVar13,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_f8._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_f8._8_8_ == 0) {
              if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
                if ((float *)local_f8._0_8_ != (float *)0x0) {
                  free((void *)local_f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_f8._32_8_)[3])();
              }
            }
          }
          local_f8._0_8_ = local_198._0_8_;
          local_f8._8_8_ = local_198._8_8_;
          local_f8._16_8_ = local_198._16_8_;
          local_f8._24_4_ = local_198._24_4_;
          local_f8._32_8_ = local_198._32_8_;
          unique0x00006c80 = local_198._40_16_;
          local_c0 = local_160;
          local_b8 = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_0039138f:
                local_f8._0_8_ = local_198._0_8_;
                local_f8._8_8_ = local_198._8_8_;
                local_f8._16_8_ = local_198._16_8_;
                local_f8._24_4_ = local_198._24_4_;
                local_f8._32_8_ = local_198._32_8_;
                unique0x10002107 = local_198._40_16_;
                local_c0 = local_160;
                local_b8 = local_158;
                if ((float *)local_198._0_8_ != (float *)0x0) {
                  free((void *)local_198._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_198._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_198,pMVar11,iVar13,1,1,1,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if ((int *)local_f8._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_f8._8_8_ == 0) {
              if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
                if ((float *)local_f8._0_8_ != (float *)0x0) {
                  free((void *)local_f8._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_f8._32_8_)[3])();
              }
            }
          }
          local_f8._0_8_ = local_198._0_8_;
          local_f8._8_8_ = local_198._8_8_;
          local_f8._16_8_ = local_198._16_8_;
          local_f8._24_4_ = local_198._24_4_;
          local_f8._32_8_ = local_198._32_8_;
          stack0xffffffffffffff30 = local_198._40_16_;
          local_c0 = local_160;
          local_b8 = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_0039138f;
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
      }
    }
    iVar13 = pMVar11->dims;
    if ((bool)(iVar13 == 2 & bVar32)) {
      Mat::reshape((Mat *)local_198,pMVar11,1,1,pMVar11->w,pMVar11->h,(Allocator *)0x0);
      if ((int *)local_198._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
        UNLOCK();
      }
      if ((int *)local_f8._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_f8._8_8_ == 0) {
          if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
            if ((float *)local_f8._0_8_ != (float *)0x0) {
              free((void *)local_f8._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_f8._32_8_)[3])();
          }
        }
      }
      local_f8._0_8_ = local_198._0_8_;
      local_f8._8_8_ = local_198._8_8_;
      local_f8._16_8_ = local_198._16_8_;
      local_f8._24_4_ = local_198._24_4_;
      local_f8._32_8_ = local_198._32_8_;
      stack0xffffffffffffff30 = local_198._40_16_;
      local_c0 = local_160;
      local_b8 = local_158;
      if ((int *)local_198._8_8_ != (int *)0x0) {
        LOCK();
        *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
        UNLOCK();
        if (*(int *)local_198._8_8_ == 0) {
          if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
            if ((float *)local_198._0_8_ != (float *)0x0) {
              free((void *)local_198._0_8_);
            }
          }
          else {
            (*(*(_func_int ***)local_198._32_8_)[3])();
          }
        }
      }
      iVar13 = pMVar11->dims;
    }
    pMVar21 = local_148;
    if (!(bool)(bVar32 & iVar13 == 3)) goto LAB_00390b50;
    Mat::reshape((Mat *)local_198,pMVar11,1,pMVar11->w,pMVar11->h,pMVar11->c,(Allocator *)0x0);
    if ((int *)local_198._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
      UNLOCK();
    }
    if ((int *)local_f8._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_f8._8_8_ == 0) {
        if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
          if ((float *)local_f8._0_8_ != (float *)0x0) {
            free((void *)local_f8._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_f8._32_8_)[3])();
        }
      }
    }
    local_f8._0_8_ = local_198._0_8_;
    local_f8._8_8_ = local_198._8_8_;
    local_f8._16_8_ = local_198._16_8_;
    local_f8._24_4_ = local_198._24_4_;
    local_f8._32_8_ = local_198._32_8_;
    stack0xffffffffffffff30 = local_198._40_16_;
    local_c0 = local_160;
    local_b8 = local_158;
    if ((int *)local_198._8_8_ != (int *)0x0) {
      LOCK();
      *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_198._8_8_ == 0) {
        if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
          if ((float *)local_198._0_8_ != (float *)0x0) {
            free((void *)local_198._0_8_);
          }
        }
        else {
          (*(*(_func_int ***)local_198._32_8_)[3])();
        }
      }
    }
    if (pMVar11[1].dims < 4) goto LAB_003915d6;
  }
  else {
LAB_00390b50:
    if (pMVar11[1].dims < iVar17) {
      if (iVar17 == 2) {
        iVar13 = pMVar11[1].w;
        if (iVar13 == pMVar11->h) {
          Mat::reshape((Mat *)local_198,pMVar21,1,iVar13,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if (local_140.refcount != (int *)0x0) {
            LOCK();
            *local_140.refcount = *local_140.refcount + -1;
            UNLOCK();
            if (*local_140.refcount == 0) {
              if (local_140.allocator == (Allocator *)0x0) {
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(local_140.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_140.data = (void *)local_198._0_8_;
          local_140.refcount = (int *)local_198._8_8_;
          local_140.elemsize = local_198._16_8_;
          local_140.elempack = local_198._24_4_;
          local_140.allocator = (Allocator *)local_198._32_8_;
          local_140.dims = local_198._40_4_;
          local_140.w = local_198._44_4_;
          local_140.h = local_198._48_4_;
          local_140.d = local_198._52_4_;
          local_140.c = local_160;
          local_140.cstep = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_003915c9:
                local_198._0_8_ = local_140.data;
                local_198._8_8_ = local_140.refcount;
                local_198._16_8_ = local_140.elemsize;
                local_198._24_4_ = local_140.elempack;
                local_198._32_8_ = local_140.allocator;
                local_160 = local_140.c;
                local_158 = local_140.cstep;
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(*(_func_int ***)local_198._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_198,pMVar21,iVar13,1,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if (local_140.refcount != (int *)0x0) {
            LOCK();
            *local_140.refcount = *local_140.refcount + -1;
            UNLOCK();
            if (*local_140.refcount == 0) {
              if (local_140.allocator == (Allocator *)0x0) {
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(local_140.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_140.data = (void *)local_198._0_8_;
          local_140.refcount = (int *)local_198._8_8_;
          local_140.elemsize = local_198._16_8_;
          local_140.elempack = local_198._24_4_;
          local_140.allocator = (Allocator *)local_198._32_8_;
          local_140.dims = local_198._40_4_;
          local_140.w = local_198._44_4_;
          local_140.h = local_198._48_4_;
          local_140.d = local_198._52_4_;
          local_140.c = local_160;
          local_140.cstep = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_003915c9;
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
LAB_003915d6:
        iVar13 = pMVar11[1].dims;
      }
      else {
        bVar32 = iVar17 == 3;
        if (pMVar11[1].dims == 1 && iVar17 == 3) {
          iVar13 = pMVar11[1].w;
          if (iVar13 == pMVar11->c) {
            Mat::reshape((Mat *)local_198,pMVar21,1,1,iVar13,(Allocator *)0x0);
            if ((int *)local_198._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
              UNLOCK();
            }
            if (local_140.refcount != (int *)0x0) {
              LOCK();
              *local_140.refcount = *local_140.refcount + -1;
              UNLOCK();
              if (*local_140.refcount == 0) {
                if (local_140.allocator == (Allocator *)0x0) {
                  if ((float *)local_140.data != (float *)0x0) {
                    free(local_140.data);
                  }
                }
                else {
                  (*(local_140.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_140.data = (void *)local_198._0_8_;
            local_140.refcount = (int *)local_198._8_8_;
            local_140.elemsize = local_198._16_8_;
            local_140.elempack = local_198._24_4_;
            local_140.allocator = (Allocator *)local_198._32_8_;
            local_140.dims = local_198._40_4_;
            local_140.w = local_198._44_4_;
            local_140.h = local_198._48_4_;
            local_140.d = local_198._52_4_;
            local_140.c = local_160;
            local_140.cstep = local_158;
            if ((int *)local_198._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_198._8_8_ == 0) {
                if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_003914c6:
                  local_140.data = (void *)local_198._0_8_;
                  local_140.refcount = (int *)local_198._8_8_;
                  local_140.elemsize = local_198._16_8_;
                  local_140.elempack = local_198._24_4_;
                  local_140.allocator = (Allocator *)local_198._32_8_;
                  local_140.c = local_160;
                  local_140.cstep = local_158;
                  if ((float *)local_198._0_8_ != (float *)0x0) {
                    free((void *)local_198._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_198._32_8_)[3])();
                }
              }
            }
          }
          else {
            Mat::reshape((Mat *)local_198,pMVar21,iVar13,1,1,(Allocator *)0x0);
            if ((int *)local_198._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
              UNLOCK();
            }
            if (local_140.refcount != (int *)0x0) {
              LOCK();
              *local_140.refcount = *local_140.refcount + -1;
              UNLOCK();
              if (*local_140.refcount == 0) {
                if (local_140.allocator == (Allocator *)0x0) {
                  if ((float *)local_140.data != (float *)0x0) {
                    free(local_140.data);
                  }
                }
                else {
                  (*(local_140.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_140.data = (void *)local_198._0_8_;
            local_140.refcount = (int *)local_198._8_8_;
            local_140.elemsize = local_198._16_8_;
            local_140.elempack = local_198._24_4_;
            local_140.allocator = (Allocator *)local_198._32_8_;
            local_140.dims = local_198._40_4_;
            local_140.w = local_198._44_4_;
            local_140.h = local_198._48_4_;
            local_140.d = local_198._52_4_;
            local_140.c = local_160;
            local_140.cstep = local_158;
            if ((int *)local_198._8_8_ != (int *)0x0) {
              LOCK();
              *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
              UNLOCK();
              if (*(int *)local_198._8_8_ == 0) {
                if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_003914c6;
                (*(*(_func_int ***)local_198._32_8_)[3])();
              }
            }
          }
          bVar32 = true;
        }
        iVar13 = pMVar11[1].dims;
        if ((bool)(iVar13 == 2 & bVar32)) {
          Mat::reshape((Mat *)local_198,pMVar21,1,pMVar11[1].w,pMVar11[1].h,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if (local_140.refcount != (int *)0x0) {
            LOCK();
            *local_140.refcount = *local_140.refcount + -1;
            UNLOCK();
            if (*local_140.refcount == 0) {
              if (local_140.allocator == (Allocator *)0x0) {
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(local_140.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_140.data = (void *)local_198._0_8_;
          local_140.refcount = (int *)local_198._8_8_;
          local_140.elemsize = local_198._16_8_;
          local_140.elempack = local_198._24_4_;
          local_140.allocator = (Allocator *)local_198._32_8_;
          local_140.dims = local_198._40_4_;
          local_140.w = local_198._44_4_;
          local_140.h = local_198._48_4_;
          local_140.d = local_198._52_4_;
          local_140.c = local_160;
          local_140.cstep = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_003915c9;
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
          goto LAB_003915d6;
        }
      }
      if ((iVar17 == 4) && (iVar13 == 1)) {
        iVar13 = pMVar11[1].w;
        if (iVar13 == pMVar11->c) {
          Mat::reshape((Mat *)local_198,pMVar21,1,1,1,iVar13,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if (local_140.refcount != (int *)0x0) {
            LOCK();
            *local_140.refcount = *local_140.refcount + -1;
            UNLOCK();
            if (*local_140.refcount == 0) {
              if (local_140.allocator == (Allocator *)0x0) {
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(local_140.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_140.data = (void *)local_198._0_8_;
          local_140.refcount = (int *)local_198._8_8_;
          local_140.elemsize = local_198._16_8_;
          local_140.elempack = local_198._24_4_;
          local_140.allocator = (Allocator *)local_198._32_8_;
          local_140.dims = local_198._40_4_;
          local_140.w = local_198._44_4_;
          local_140.h = local_198._48_4_;
          local_140.d = local_198._52_4_;
          local_140.c = local_160;
          local_140.cstep = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
LAB_003917eb:
                local_140.data = (void *)local_198._0_8_;
                local_140.refcount = (int *)local_198._8_8_;
                local_140.elemsize = local_198._16_8_;
                local_140.elempack = local_198._24_4_;
                local_140.allocator = (Allocator *)local_198._32_8_;
                local_140.c = local_160;
                local_140.cstep = local_158;
                if ((float *)local_198._0_8_ != (float *)0x0) {
                  free((void *)local_198._0_8_);
                }
              }
              else {
                (*(*(_func_int ***)local_198._32_8_)[3])();
              }
            }
          }
        }
        else {
          Mat::reshape((Mat *)local_198,pMVar21,iVar13,1,1,1,(Allocator *)0x0);
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
            UNLOCK();
          }
          if (local_140.refcount != (int *)0x0) {
            LOCK();
            *local_140.refcount = *local_140.refcount + -1;
            UNLOCK();
            if (*local_140.refcount == 0) {
              if (local_140.allocator == (Allocator *)0x0) {
                if ((float *)local_140.data != (float *)0x0) {
                  free(local_140.data);
                }
              }
              else {
                (*(local_140.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_140.data = (void *)local_198._0_8_;
          local_140.refcount = (int *)local_198._8_8_;
          local_140.elemsize = local_198._16_8_;
          local_140.elempack = local_198._24_4_;
          local_140.allocator = (Allocator *)local_198._32_8_;
          local_140.dims = local_198._40_4_;
          local_140.w = local_198._44_4_;
          local_140.h = local_198._48_4_;
          local_140.d = local_198._52_4_;
          local_140.c = local_160;
          local_140.cstep = local_158;
          if ((int *)local_198._8_8_ != (int *)0x0) {
            LOCK();
            *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
            UNLOCK();
            if (*(int *)local_198._8_8_ == 0) {
              if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) goto LAB_003917eb;
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
      }
      iVar13 = pMVar11[1].dims;
      if (iVar13 == 2 && iVar17 == 4) {
        Mat::reshape((Mat *)local_198,pMVar21,1,1,pMVar11[1].w,pMVar11[1].h,(Allocator *)0x0);
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
          UNLOCK();
        }
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + -1;
          UNLOCK();
          if (*local_140.refcount == 0) {
            if (local_140.allocator == (Allocator *)0x0) {
              if ((float *)local_140.data != (float *)0x0) {
                free(local_140.data);
              }
            }
            else {
              (*(local_140.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_140.data = (void *)local_198._0_8_;
        local_140.refcount = (int *)local_198._8_8_;
        local_140.elemsize = local_198._16_8_;
        local_140.elempack = local_198._24_4_;
        local_140.allocator = (Allocator *)local_198._32_8_;
        local_140.dims = local_198._40_4_;
        local_140.w = local_198._44_4_;
        local_140.h = local_198._48_4_;
        local_140.d = local_198._52_4_;
        local_140.c = local_160;
        local_140.cstep = local_158;
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._8_8_ == 0) {
            if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
              if ((float *)local_198._0_8_ != (float *)0x0) {
                free((void *)local_198._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
        iVar13 = pMVar11[1].dims;
      }
      if ((iVar17 == 4) && (iVar13 == 3)) {
        Mat::reshape((Mat *)local_198,pMVar21,1,pMVar11[1].w,pMVar11[1].h,pMVar11[1].c,
                     (Allocator *)0x0);
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + 1;
          UNLOCK();
        }
        if (local_140.refcount != (int *)0x0) {
          LOCK();
          *local_140.refcount = *local_140.refcount + -1;
          UNLOCK();
          if (*local_140.refcount == 0) {
            if (local_140.allocator == (Allocator *)0x0) {
              if ((float *)local_140.data != (float *)0x0) {
                free(local_140.data);
              }
            }
            else {
              (*(local_140.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        local_140.data = (void *)local_198._0_8_;
        local_140.refcount = (int *)local_198._8_8_;
        local_140.elemsize = local_198._16_8_;
        local_140.elempack = local_198._24_4_;
        local_140.allocator = (Allocator *)local_198._32_8_;
        local_140.dims = local_198._40_4_;
        local_140.w = local_198._44_4_;
        local_140.h = local_198._48_4_;
        local_140.d = local_198._52_4_;
        local_140.c = local_160;
        local_140.cstep = local_158;
        if ((int *)local_198._8_8_ != (int *)0x0) {
          LOCK();
          *(int *)local_198._8_8_ = *(int *)local_198._8_8_ + -1;
          UNLOCK();
          if (*(int *)local_198._8_8_ == 0) {
            if ((Allocator *)local_198._32_8_ == (Allocator *)0x0) {
              if ((float *)local_198._0_8_ != (float *)0x0) {
                free((void *)local_198._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_198._32_8_)[3])();
            }
          }
        }
      }
    }
  }
  iVar13 = local_140.w;
  if (local_140.w < iStack_cc) {
    iVar13 = iStack_cc;
  }
  iVar18 = local_140.h;
  if (local_140.h < (int)uStack_c8) {
    iVar18 = (int)uStack_c8;
  }
  iVar8 = local_140.c;
  if (local_140.c < local_c0) {
    iVar8 = local_c0;
  }
  pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  switch(iVar17) {
  case 1:
    Mat::create(pMVar11,iVar13,4,opt->blob_allocator);
    break;
  case 2:
    Mat::create(pMVar11,iVar13,iVar18,4,opt->blob_allocator);
    break;
  case 3:
    Mat::create(pMVar11,iVar13,iVar18,iVar8,4,opt->blob_allocator);
    break;
  case 4:
    iVar17 = local_140.d;
    if (local_140.d < uStack_c8._4_4_) {
      iVar17 = uStack_c8._4_4_;
    }
    Mat::create(pMVar11,iVar13,iVar18,iVar17,iVar8,4,opt->blob_allocator);
  }
  local_80 = pMVar11->data;
  iVar17 = -100;
  if (local_80 == (void *)0x0) goto switchD_00391b2c_default;
  local_88 = pMVar11->cstep;
  iVar13 = pMVar11->c;
  local_78 = (long)iVar13;
  if (local_88 * local_78 == 0) goto switchD_00391b2c_default;
  iVar17 = 0;
  iVar18 = 0;
  switch(this->op_type) {
  case 0:
    iVar8 = pMVar11->dims;
    uVar9 = pMVar11->w;
    uVar28 = (ulong)uVar9;
    local_b0 = (long)(int)uVar9;
    uVar10 = pMVar11->h;
    local_148 = (Mat *)(ulong)uVar10;
    local_14c = pMVar11->d;
    if (iVar8 == 2) {
      iVar17 = iVar18;
      if ((int)uVar10 < 1) break;
      local_90 = (float *)local_f8._0_8_;
      local_98 = (float *)local_140.data;
      sVar12 = pMVar11->elemsize;
      pMVar21 = (Mat *)0x0;
      pvVar31 = local_80;
      do {
        pMVar20 = (Mat *)(long)((int)uStack_c8 + -1);
        if ((long)pMVar21 < (long)((int)uStack_c8 + -1)) {
          pMVar20 = pMVar21;
        }
        pMVar16 = (Mat *)(long)(local_140.h + -1);
        if ((long)pMVar21 < (long)(local_140.h + -1)) {
          pMVar16 = pMVar21;
        }
        if (0 < (int)uVar9) {
          pfVar26 = (float *)((long)pMVar20 * (long)iStack_cc * local_f8._16_8_ + local_f8._0_8_);
          pfVar23 = (float *)((long)pMVar16 * (long)local_140.w * local_140.elemsize +
                             (long)local_140.data);
          uVar24 = 0;
          do {
            *(float *)((long)pvVar31 + uVar24 * 4) = *pfVar23 + *pfVar26;
            uVar24 = uVar24 + 1;
            pfVar26 = pfVar26 + (1 < (long)iStack_cc);
            pfVar23 = pfVar23 + (1 < (long)local_140.w);
          } while (uVar28 != uVar24);
        }
        pMVar21 = (Mat *)((long)&pMVar21->data + 1);
        pvVar31 = (void *)((long)pvVar31 + sVar12 * local_b0);
      } while (pMVar21 != local_148);
    }
    else {
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      if (iVar8 == 1) {
        iVar17 = iVar18;
        if ((int)uVar9 < 1) break;
        uVar24 = 0;
        pfVar23 = (float *)local_140.data;
        pfVar26 = (float *)local_f8._0_8_;
        do {
          *(float *)((long)local_80 + uVar24 * 4) = *pfVar23 + *pfVar26;
          uVar24 = uVar24 + 1;
          pfVar26 = pfVar26 + (1 < iStack_cc);
          pfVar23 = pfVar23 + (1 < local_140.w);
        } while (uVar28 != uVar24);
      }
    }
    local_a8 = CONCAT44(local_a8._4_4_,iVar8);
    iVar17 = iVar18;
    local_38 = uVar28;
    if (0 < iVar13 && iVar8 - 3U < 2) {
      local_88 = local_88 * pMVar11->elemsize;
      lVar30 = local_b0 * 4;
      local_a0 = 0;
      do {
        if (0 < local_14c) {
          pvVar31 = (void *)(local_88 * local_a0 + (long)local_80);
          local_90 = (float *)(long)iStack_cc;
          local_68 = (long)(int)uStack_c8;
          local_98 = (float *)local_f8._0_8_;
          local_a8 = local_f8._16_8_;
          local_b0 = (long)local_140.w;
          local_70 = (long)local_140.h;
          local_40 = (float *)local_140.data;
          local_48 = local_140.elemsize;
          lVar27 = (long)(local_140.c + -1);
          if (local_a0 < local_140.c + -1) {
            lVar27 = local_a0;
          }
          local_58 = (long)(local_140.d + -1);
          lVar14 = (long)(local_c0 + -1);
          if (local_a0 < local_c0 + -1) {
            lVar14 = local_a0;
          }
          local_60 = (long)(uStack_c8._4_4_ + -1);
          lVar29 = 0;
          do {
            local_50 = lVar29;
            lVar29 = local_58;
            if (local_50 < local_58) {
              lVar29 = local_50;
            }
            lVar19 = local_60;
            if (local_50 < local_60) {
              lVar19 = local_50;
            }
            if (0 < (int)uVar10) {
              lVar15 = 0;
              do {
                lVar25 = (long)(local_140.h + -1);
                if (lVar15 < local_140.h + -1) {
                  lVar25 = lVar15;
                }
                lVar22 = (long)((int)uStack_c8 + -1);
                if (lVar15 < (int)uStack_c8 + -1) {
                  lVar22 = lVar15;
                }
                if (0 < (int)uVar9) {
                  pfVar26 = (float *)(((lVar25 + lVar29 * local_70) * local_b0 +
                                      lVar27 * local_140.cstep) * local_140.elemsize +
                                     (long)local_140.data);
                  pfVar23 = (float *)(((lVar22 + lVar19 * local_68) * (long)local_90 +
                                      lVar14 * local_b8) * local_f8._16_8_ + local_f8._0_8_);
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) = *pfVar26 + *pfVar23;
                    uVar28 = uVar28 + 1;
                    pfVar26 = pfVar26 + (1 < local_140.w);
                    pfVar23 = pfVar23 + (1 < iStack_cc);
                  } while (uVar9 != uVar28);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar30);
                lVar15 = lVar15 + 1;
              } while ((uint)lVar15 != uVar10);
            }
            lVar29 = local_50 + 1;
          } while ((int)(local_50 + 1) != local_14c);
        }
        local_a0 = local_a0 + 1;
        iVar17 = 0;
      } while (local_a0 != local_78);
    }
    break;
  case 1:
    pMVar21 = (Mat *)local_f8;
    pMVar20 = &local_140;
    goto LAB_00391d57;
  case 2:
    iVar8 = pMVar11->dims;
    uVar9 = pMVar11->w;
    uVar28 = (ulong)uVar9;
    local_b0 = (long)(int)uVar9;
    uVar10 = pMVar11->h;
    local_148 = (Mat *)(ulong)uVar10;
    local_14c = pMVar11->d;
    if (iVar8 == 2) {
      iVar17 = iVar18;
      if ((int)uVar10 < 1) break;
      local_90 = (float *)local_f8._0_8_;
      local_98 = (float *)local_140.data;
      sVar12 = pMVar11->elemsize;
      pMVar21 = (Mat *)0x0;
      pvVar31 = local_80;
      do {
        pMVar20 = (Mat *)(long)((int)uStack_c8 + -1);
        if ((long)pMVar21 < (long)((int)uStack_c8 + -1)) {
          pMVar20 = pMVar21;
        }
        pMVar16 = (Mat *)(long)(local_140.h + -1);
        if ((long)pMVar21 < (long)(local_140.h + -1)) {
          pMVar16 = pMVar21;
        }
        if (0 < (int)uVar9) {
          pfVar26 = (float *)((long)pMVar20 * (long)iStack_cc * local_f8._16_8_ + local_f8._0_8_);
          pfVar23 = (float *)((long)pMVar16 * (long)local_140.w * local_140.elemsize +
                             (long)local_140.data);
          uVar24 = 0;
          do {
            *(float *)((long)pvVar31 + uVar24 * 4) = *pfVar23 * *pfVar26;
            uVar24 = uVar24 + 1;
            pfVar26 = pfVar26 + (1 < (long)iStack_cc);
            pfVar23 = pfVar23 + (1 < (long)local_140.w);
          } while (uVar28 != uVar24);
        }
        pMVar21 = (Mat *)((long)&pMVar21->data + 1);
        pvVar31 = (void *)((long)pvVar31 + sVar12 * local_b0);
      } while (pMVar21 != local_148);
    }
    else {
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      if (iVar8 == 1) {
        iVar17 = iVar18;
        if ((int)uVar9 < 1) break;
        uVar24 = 0;
        pfVar23 = (float *)local_140.data;
        pfVar26 = (float *)local_f8._0_8_;
        do {
          *(float *)((long)local_80 + uVar24 * 4) = *pfVar23 * *pfVar26;
          uVar24 = uVar24 + 1;
          pfVar26 = pfVar26 + (1 < iStack_cc);
          pfVar23 = pfVar23 + (1 < local_140.w);
        } while (uVar28 != uVar24);
      }
    }
    local_a8 = CONCAT44(local_a8._4_4_,iVar8);
    iVar17 = iVar18;
    local_38 = uVar28;
    if (0 < iVar13 && iVar8 - 3U < 2) {
      local_88 = local_88 * pMVar11->elemsize;
      lVar30 = local_b0 * 4;
      local_a0 = 0;
      do {
        if (0 < local_14c) {
          pvVar31 = (void *)(local_88 * local_a0 + (long)local_80);
          local_90 = (float *)(long)iStack_cc;
          local_68 = (long)(int)uStack_c8;
          local_98 = (float *)local_f8._0_8_;
          local_a8 = local_f8._16_8_;
          local_b0 = (long)local_140.w;
          local_70 = (long)local_140.h;
          local_40 = (float *)local_140.data;
          local_48 = local_140.elemsize;
          lVar27 = (long)(local_140.c + -1);
          if (local_a0 < local_140.c + -1) {
            lVar27 = local_a0;
          }
          local_58 = (long)(local_140.d + -1);
          lVar14 = (long)(local_c0 + -1);
          if (local_a0 < local_c0 + -1) {
            lVar14 = local_a0;
          }
          local_60 = (long)(uStack_c8._4_4_ + -1);
          lVar29 = 0;
          do {
            local_50 = lVar29;
            lVar29 = local_58;
            if (local_50 < local_58) {
              lVar29 = local_50;
            }
            lVar19 = local_60;
            if (local_50 < local_60) {
              lVar19 = local_50;
            }
            if (0 < (int)uVar10) {
              lVar15 = 0;
              do {
                lVar25 = (long)(local_140.h + -1);
                if (lVar15 < local_140.h + -1) {
                  lVar25 = lVar15;
                }
                lVar22 = (long)((int)uStack_c8 + -1);
                if (lVar15 < (int)uStack_c8 + -1) {
                  lVar22 = lVar15;
                }
                if (0 < (int)uVar9) {
                  pfVar26 = (float *)(((lVar25 + lVar29 * local_70) * local_b0 +
                                      lVar27 * local_140.cstep) * local_140.elemsize +
                                     (long)local_140.data);
                  pfVar23 = (float *)(((lVar22 + lVar19 * local_68) * (long)local_90 +
                                      lVar14 * local_b8) * local_f8._16_8_ + local_f8._0_8_);
                  uVar28 = 0;
                  do {
                    *(float *)((long)pvVar31 + uVar28 * 4) = *pfVar26 * *pfVar23;
                    uVar28 = uVar28 + 1;
                    pfVar26 = pfVar26 + (1 < local_140.w);
                    pfVar23 = pfVar23 + (1 < iStack_cc);
                  } while (uVar9 != uVar28);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar30);
                lVar15 = lVar15 + 1;
              } while ((uint)lVar15 != uVar10);
            }
            lVar29 = local_50 + 1;
          } while ((int)(local_50 + 1) != local_14c);
        }
        local_a0 = local_a0 + 1;
        iVar17 = 0;
      } while (local_a0 != local_78);
    }
    break;
  case 3:
    pMVar20 = (Mat *)local_f8;
    pMVar21 = &local_140;
    goto LAB_00391e3c;
  case 4:
    iVar8 = pMVar11->dims;
    uVar9 = pMVar11->w;
    uVar28 = (ulong)uVar9;
    local_b0 = (long)(int)uVar9;
    uVar10 = pMVar11->h;
    local_148 = (Mat *)(ulong)uVar10;
    local_14c = pMVar11->d;
    if (iVar8 == 2) {
      iVar17 = iVar18;
      if ((int)uVar10 < 1) break;
      local_90 = (float *)local_f8._0_8_;
      local_98 = (float *)local_140.data;
      sVar12 = pMVar11->elemsize;
      pMVar21 = (Mat *)0x0;
      pvVar31 = local_80;
      do {
        pMVar20 = (Mat *)(long)((int)uStack_c8 + -1);
        if ((long)pMVar21 < (long)((int)uStack_c8 + -1)) {
          pMVar20 = pMVar21;
        }
        pMVar16 = (Mat *)(long)(local_140.h + -1);
        if ((long)pMVar21 < (long)(local_140.h + -1)) {
          pMVar16 = pMVar21;
        }
        if (0 < (int)uVar9) {
          pfVar26 = (float *)((long)pMVar20 * (long)iStack_cc * local_f8._16_8_ + local_f8._0_8_);
          pfVar23 = (float *)((long)pMVar16 * (long)local_140.w * local_140.elemsize +
                             (long)local_140.data);
          uVar24 = 0;
          do {
            fVar1 = *pfVar23;
            if (*pfVar23 <= *pfVar26) {
              fVar1 = *pfVar26;
            }
            *(float *)((long)pvVar31 + uVar24 * 4) = fVar1;
            uVar24 = uVar24 + 1;
            pfVar26 = pfVar26 + (1 < (long)iStack_cc);
            pfVar23 = pfVar23 + (1 < (long)local_140.w);
          } while (uVar28 != uVar24);
        }
        pMVar21 = (Mat *)((long)&pMVar21->data + 1);
        pvVar31 = (void *)((long)pvVar31 + sVar12 * local_b0);
      } while (pMVar21 != local_148);
    }
    else {
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      if (iVar8 == 1) {
        iVar17 = iVar18;
        if ((int)uVar9 < 1) break;
        uVar24 = 0;
        pfVar23 = (float *)local_140.data;
        pfVar26 = (float *)local_f8._0_8_;
        do {
          fVar1 = *pfVar23;
          if (*pfVar23 <= *pfVar26) {
            fVar1 = *pfVar26;
          }
          *(float *)((long)local_80 + uVar24 * 4) = fVar1;
          uVar24 = uVar24 + 1;
          pfVar26 = pfVar26 + (1 < iStack_cc);
          pfVar23 = pfVar23 + (1 < local_140.w);
        } while (uVar28 != uVar24);
      }
    }
    local_a8 = CONCAT44(local_a8._4_4_,iVar8);
    iVar17 = iVar18;
    local_38 = uVar28;
    if (0 < iVar13 && iVar8 - 3U < 2) {
      local_88 = local_88 * pMVar11->elemsize;
      lVar30 = local_b0 * 4;
      local_a0 = 0;
      do {
        if (0 < local_14c) {
          pvVar31 = (void *)(local_88 * local_a0 + (long)local_80);
          local_90 = (float *)(long)iStack_cc;
          local_68 = (long)(int)uStack_c8;
          local_98 = (float *)local_f8._0_8_;
          local_a8 = local_f8._16_8_;
          local_b0 = (long)local_140.w;
          local_70 = (long)local_140.h;
          local_40 = (float *)local_140.data;
          local_48 = local_140.elemsize;
          lVar27 = (long)(local_140.c + -1);
          if (local_a0 < local_140.c + -1) {
            lVar27 = local_a0;
          }
          local_58 = (long)(local_140.d + -1);
          lVar14 = (long)(local_c0 + -1);
          if (local_a0 < local_c0 + -1) {
            lVar14 = local_a0;
          }
          local_60 = (long)(uStack_c8._4_4_ + -1);
          lVar29 = 0;
          do {
            local_50 = lVar29;
            lVar29 = local_58;
            if (local_50 < local_58) {
              lVar29 = local_50;
            }
            lVar19 = local_60;
            if (local_50 < local_60) {
              lVar19 = local_50;
            }
            if (0 < (int)uVar10) {
              lVar15 = 0;
              do {
                lVar25 = (long)(local_140.h + -1);
                if (lVar15 < local_140.h + -1) {
                  lVar25 = lVar15;
                }
                lVar22 = (long)((int)uStack_c8 + -1);
                if (lVar15 < (int)uStack_c8 + -1) {
                  lVar22 = lVar15;
                }
                if (0 < (int)uVar9) {
                  pfVar26 = (float *)(((lVar25 + lVar29 * local_70) * local_b0 +
                                      lVar27 * local_140.cstep) * local_140.elemsize +
                                     (long)local_140.data);
                  pfVar23 = (float *)(((lVar22 + lVar19 * local_68) * (long)local_90 +
                                      lVar14 * local_b8) * local_f8._16_8_ + local_f8._0_8_);
                  uVar28 = 0;
                  do {
                    fVar1 = *pfVar26;
                    if (*pfVar26 <= *pfVar23) {
                      fVar1 = *pfVar23;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar1;
                    uVar28 = uVar28 + 1;
                    pfVar26 = pfVar26 + (1 < local_140.w);
                    pfVar23 = pfVar23 + (1 < iStack_cc);
                  } while (uVar9 != uVar28);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar30);
                lVar15 = lVar15 + 1;
              } while ((uint)lVar15 != uVar10);
            }
            lVar29 = local_50 + 1;
          } while ((int)(local_50 + 1) != local_14c);
        }
        local_a0 = local_a0 + 1;
        iVar17 = 0;
      } while (local_a0 != local_78);
    }
    break;
  case 5:
    iVar8 = pMVar11->dims;
    uVar9 = pMVar11->w;
    uVar28 = (ulong)uVar9;
    local_b0 = (long)(int)uVar9;
    uVar10 = pMVar11->h;
    local_148 = (Mat *)(ulong)uVar10;
    local_14c = pMVar11->d;
    if (iVar8 == 2) {
      iVar17 = iVar18;
      if ((int)uVar10 < 1) break;
      local_90 = (float *)local_f8._0_8_;
      local_98 = (float *)local_140.data;
      sVar12 = pMVar11->elemsize;
      pMVar21 = (Mat *)0x0;
      pvVar31 = local_80;
      do {
        pMVar20 = (Mat *)(long)((int)uStack_c8 + -1);
        if ((long)pMVar21 < (long)((int)uStack_c8 + -1)) {
          pMVar20 = pMVar21;
        }
        pMVar16 = (Mat *)(long)(local_140.h + -1);
        if ((long)pMVar21 < (long)(local_140.h + -1)) {
          pMVar16 = pMVar21;
        }
        if (0 < (int)uVar9) {
          pfVar26 = (float *)((long)pMVar20 * (long)iStack_cc * local_f8._16_8_ + local_f8._0_8_);
          pfVar23 = (float *)((long)pMVar16 * (long)local_140.w * local_140.elemsize +
                             (long)local_140.data);
          uVar24 = 0;
          do {
            fVar1 = *pfVar23;
            if (*pfVar26 <= *pfVar23) {
              fVar1 = *pfVar26;
            }
            *(float *)((long)pvVar31 + uVar24 * 4) = fVar1;
            uVar24 = uVar24 + 1;
            pfVar26 = pfVar26 + (1 < (long)iStack_cc);
            pfVar23 = pfVar23 + (1 < (long)local_140.w);
          } while (uVar28 != uVar24);
        }
        pMVar21 = (Mat *)((long)&pMVar21->data + 1);
        pvVar31 = (void *)((long)pvVar31 + sVar12 * local_b0);
      } while (pMVar21 != local_148);
    }
    else {
      local_a8 = CONCAT44(local_a8._4_4_,iVar8);
      if (iVar8 == 1) {
        iVar17 = iVar18;
        if ((int)uVar9 < 1) break;
        uVar24 = 0;
        pfVar23 = (float *)local_140.data;
        pfVar26 = (float *)local_f8._0_8_;
        do {
          fVar1 = *pfVar23;
          if (*pfVar26 <= *pfVar23) {
            fVar1 = *pfVar26;
          }
          *(float *)((long)local_80 + uVar24 * 4) = fVar1;
          uVar24 = uVar24 + 1;
          pfVar26 = pfVar26 + (1 < iStack_cc);
          pfVar23 = pfVar23 + (1 < local_140.w);
        } while (uVar28 != uVar24);
      }
    }
    local_a8 = CONCAT44(local_a8._4_4_,iVar8);
    iVar17 = iVar18;
    local_38 = uVar28;
    if (0 < iVar13 && iVar8 - 3U < 2) {
      local_88 = local_88 * pMVar11->elemsize;
      lVar30 = local_b0 * 4;
      local_a0 = 0;
      do {
        if (0 < local_14c) {
          pvVar31 = (void *)(local_88 * local_a0 + (long)local_80);
          local_90 = (float *)(long)iStack_cc;
          local_68 = (long)(int)uStack_c8;
          local_98 = (float *)local_f8._0_8_;
          local_a8 = local_f8._16_8_;
          local_b0 = (long)local_140.w;
          local_70 = (long)local_140.h;
          local_40 = (float *)local_140.data;
          local_48 = local_140.elemsize;
          lVar27 = (long)(local_140.c + -1);
          if (local_a0 < local_140.c + -1) {
            lVar27 = local_a0;
          }
          local_58 = (long)(local_140.d + -1);
          lVar14 = (long)(local_c0 + -1);
          if (local_a0 < local_c0 + -1) {
            lVar14 = local_a0;
          }
          local_60 = (long)(uStack_c8._4_4_ + -1);
          lVar29 = 0;
          do {
            local_50 = lVar29;
            lVar29 = local_58;
            if (local_50 < local_58) {
              lVar29 = local_50;
            }
            lVar19 = local_60;
            if (local_50 < local_60) {
              lVar19 = local_50;
            }
            if (0 < (int)uVar10) {
              lVar15 = 0;
              do {
                lVar25 = (long)(local_140.h + -1);
                if (lVar15 < local_140.h + -1) {
                  lVar25 = lVar15;
                }
                lVar22 = (long)((int)uStack_c8 + -1);
                if (lVar15 < (int)uStack_c8 + -1) {
                  lVar22 = lVar15;
                }
                if (0 < (int)uVar9) {
                  pfVar26 = (float *)(((lVar25 + lVar29 * local_70) * local_b0 +
                                      lVar27 * local_140.cstep) * local_140.elemsize +
                                     (long)local_140.data);
                  pfVar23 = (float *)(((lVar22 + lVar19 * local_68) * (long)local_90 +
                                      lVar14 * local_b8) * local_f8._16_8_ + local_f8._0_8_);
                  uVar28 = 0;
                  do {
                    fVar1 = *pfVar26;
                    if (*pfVar23 <= *pfVar26) {
                      fVar1 = *pfVar23;
                    }
                    *(float *)((long)pvVar31 + uVar28 * 4) = fVar1;
                    uVar28 = uVar28 + 1;
                    pfVar26 = pfVar26 + (1 < local_140.w);
                    pfVar23 = pfVar23 + (1 < iStack_cc);
                  } while (uVar9 != uVar28);
                }
                pvVar31 = (void *)((long)pvVar31 + lVar30);
                lVar15 = lVar15 + 1;
              } while ((uint)lVar15 != uVar10);
            }
            lVar29 = local_50 + 1;
          } while ((int)(local_50 + 1) != local_14c);
        }
        local_a0 = local_a0 + 1;
        iVar17 = 0;
      } while (local_a0 != local_78);
    }
    break;
  case 6:
    pMVar21 = (Mat *)local_f8;
    pMVar20 = &local_140;
    goto LAB_00391e0e;
  case 7:
    pMVar21 = &local_140;
    pMVar20 = (Mat *)local_f8;
LAB_00391d57:
    binary_op_broadcast<ncnn::binary_op_sub>
              (pMVar21,pMVar20,pMVar11,(Option *)&switchD_00391b2c::switchdataD_005ab464);
    iVar17 = iVar18;
    break;
  case 8:
    pMVar20 = &local_140;
    pMVar21 = (Mat *)local_f8;
LAB_00391e3c:
    binary_op_broadcast<ncnn::binary_op_div>
              (pMVar20,pMVar21,pMVar11,(Option *)&switchD_00391b2c::switchdataD_005ab464);
    iVar17 = 0;
    break;
  case 9:
    pMVar21 = &local_140;
    pMVar20 = (Mat *)local_f8;
LAB_00391e0e:
    binary_op_broadcast<ncnn::binary_op_pow>
              (pMVar21,pMVar20,pMVar11,(Option *)&switchD_00391b2c::switchdataD_005ab464);
    break;
  case 10:
    pMVar21 = (Mat *)local_f8;
    pMVar20 = &local_140;
    goto LAB_00391e25;
  case 0xb:
    pMVar21 = &local_140;
    pMVar20 = (Mat *)local_f8;
LAB_00391e25:
    binary_op_broadcast<ncnn::binary_op_atan2>
              (pMVar21,pMVar20,pMVar11,(Option *)&switchD_00391b2c::switchdataD_005ab464);
  }
switchD_00391b2c_default:
  if (local_140.refcount != (int *)0x0) {
    LOCK();
    *local_140.refcount = *local_140.refcount + -1;
    UNLOCK();
    if (*local_140.refcount == 0) {
      if (local_140.allocator == (Allocator *)0x0) {
        if ((float *)local_140.data != (float *)0x0) {
          free(local_140.data);
        }
      }
      else {
        (*(local_140.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((int *)local_f8._8_8_ != (int *)0x0) {
    LOCK();
    *(int *)local_f8._8_8_ = *(int *)local_f8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_f8._8_8_ == 0) {
      if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
        if ((float *)local_f8._0_8_ != (float *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_f8._32_8_)[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int BinaryOp::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A = bottom_blobs[0];
    const Mat& B = bottom_blobs[1];
    const int outdims = std::max(A.dims, B.dims);

    Mat A2 = A;
    Mat B2 = B;
    if (A.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (A.w == B.h)
                A2 = A.reshape(1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1);
        }
        if (outdims == 3 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1);
        }
        if (outdims == 3 && A.dims == 2)
            A2 = A.reshape(1, A.w, A.h);
        if (outdims == 4 && A.dims == 1)
        {
            if (A.w == B.c)
                A2 = A.reshape(1, 1, 1, A.w);
            else // if (A.w == B.w)
                A2 = A.reshape(A.w, 1, 1, 1);
        }
        if (outdims == 4 && A.dims == 2)
            A2 = A.reshape(1, 1, A.w, A.h);
        if (outdims == 4 && A.dims == 3)
            A2 = A.reshape(1, A.w, A.h, A.c);
    }
    if (B.dims < outdims)
    {
        // expand inner axes
        if (outdims == 2)
        {
            if (B.w == A.h)
                B2 = B.reshape(1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1);
        }
        if (outdims == 3 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1);
        }
        if (outdims == 3 && B.dims == 2)
            B2 = B.reshape(1, B.w, B.h);
        if (outdims == 4 && B.dims == 1)
        {
            if (B.w == A.c)
                B2 = B.reshape(1, 1, 1, B.w);
            else // if (B.w == A.w)
                B2 = B.reshape(B.w, 1, 1, 1);
        }
        if (outdims == 4 && B.dims == 2)
            B2 = B.reshape(1, 1, B.w, B.h);
        if (outdims == 4 && B.dims == 3)
            B2 = B.reshape(1, B.w, B.h, B.c);
    }

    const int outw = std::max(A2.w, B2.w);
    const int outh = std::max(A2.h, B2.h);
    const int outd = std::max(A2.d, B2.d);
    const int outc = std::max(A2.c, B2.c);

    Mat& top_blob = top_blobs[0];
    if (outdims == 1)
    {
        top_blob.create(outw, 4u, opt.blob_allocator);
    }
    if (outdims == 2)
    {
        top_blob.create(outw, outh, 4u, opt.blob_allocator);
    }
    if (outdims == 3)
    {
        top_blob.create(outw, outh, outc, 4u, opt.blob_allocator);
    }
    if (outdims == 4)
    {
        top_blob.create(outw, outh, outd, outc, 4u, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    binary_op_broadcast(A2, B2, top_blob, op_type, opt);

    return 0;
}